

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffiimg(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  int iVar1;
  LONGLONG tnaxes [99];
  LONGLONG aLStack_338 [99];
  
  if (0 < *status) {
    return *status;
  }
  if (naxis < 100) {
    if (0 < naxis) {
      memcpy(aLStack_338,naxes,(ulong)(uint)naxis << 3);
    }
    ffiimgll(fptr,bitpix,naxis,aLStack_338,status);
    iVar1 = *status;
  }
  else {
    ffpmsg("NAXIS value is too large (>99)  (ffiimg)");
    *status = 0xd4;
    iVar1 = 0xd4;
  }
  return iVar1;
}

Assistant:

int ffiimg(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  insert an IMAGE extension following the current HDU 
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    if (naxis > 99) {
        ffpmsg("NAXIS value is too large (>99)  (ffiimg)");
	return(*status = 212);
    }

    for (ii = 0; (ii < naxis); ii++)
       tnaxes[ii] = naxes[ii];
       
    ffiimgll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}